

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int numberOfCachePages(PCache *p)

{
  PCache *p_local;
  
  if (p->szCache < 0) {
    p_local._4_4_ = (int)(((long)p->szCache * -0x400) / (long)(p->szPage + p->szExtra));
  }
  else {
    p_local._4_4_ = p->szCache;
  }
  return p_local._4_4_;
}

Assistant:

static int numberOfCachePages(PCache *p){
  if( p->szCache>=0 ){
    /* IMPLEMENTATION-OF: R-42059-47211 If the argument N is positive then the
    ** suggested cache size is set to N. */
    return p->szCache;
  }else{
    /* IMPLEMENTATION-OF: R-61436-13639 If the argument N is negative, then
    ** the number of cache pages is adjusted to use approximately abs(N*1024)
    ** bytes of memory. */
    return (int)((-1024*(i64)p->szCache)/(p->szPage+p->szExtra));
  }
}